

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gem_keytrans.cpp
# Opt level: O3

ostream * operator<<(ostream *os,Am_Drawonable *d)

{
  size_t sVar1;
  ostream *poVar2;
  char *__s;
  
  if (d == (Am_Drawonable *)0x0) {
    __s = "(0L) Drawonable";
    sVar1 = 0xf;
  }
  else {
    __s = d->title;
    if (__s == (char *)0x0) {
      std::ios::clear((int)os + (int)*(undefined8 *)(*(long *)os + -0x18));
      goto LAB_001a14fc;
    }
    sVar1 = strlen(__s);
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,__s,sVar1);
LAB_001a14fc:
  std::__ostream_insert<char,std::char_traits<char>>(os," (",2);
  *(uint *)(os + *(long *)(*(long *)os + -0x18) + 0x18) =
       *(uint *)(os + *(long *)(*(long *)os + -0x18) + 0x18) & 0xffffffb5 | 8;
  poVar2 = std::ostream::_M_insert<void_const*>(os);
  *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) =
       *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) & 0xffffffb5 | 2;
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,")",1);
  return os;
}

Assistant:

std::ostream &
operator<<(std::ostream &os, Am_Drawonable *d)
{
  if (d)
    os << d->Get_Title();
  else
    os << "(0L) Drawonable";
  os << " (" << std::hex << (void *)d << std::dec << ")";
  return os;
}